

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compat.hpp
# Opt level: O1

string * __thiscall
toml::cxx::to_string_abi_cxx11_(string *__return_storage_ptr__,cxx *this,source_location *loc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  pointer pcVar5;
  uint uVar6;
  uint uVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  size_t sVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  undefined8 uVar13;
  _Alloc_hider _Var14;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (*(undefined8 **)this == (undefined8 *)0x0) {
    __s = "";
  }
  else {
    __s = (char *)**(undefined8 **)this;
  }
  if (__s == (char *)0x0) {
    paVar2 = &local_b0.field_2;
    local_b0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0," at line ","");
    if (*(long *)this == 0) {
      uVar11 = 0;
    }
    else {
      uVar11 = *(uint *)(*(long *)this + 0x10);
    }
    uVar7 = 1;
    if (9 < uVar11) {
      uVar12 = (ulong)uVar11;
      uVar6 = 4;
      do {
        uVar7 = uVar6;
        uVar10 = (uint)uVar12;
        if (uVar10 < 100) {
          uVar7 = uVar7 - 2;
          goto LAB_003c0d8f;
        }
        if (uVar10 < 1000) {
          uVar7 = uVar7 - 1;
          goto LAB_003c0d8f;
        }
        if (uVar10 < 10000) goto LAB_003c0d8f;
        uVar12 = uVar12 / 10000;
        uVar6 = uVar7 + 4;
      } while (99999 < uVar10);
      uVar7 = uVar7 + 1;
    }
LAB_003c0d8f:
    paVar1 = &local_90.field_2;
    local_90._M_dataplus._M_p = (pointer)paVar1;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
    _M_construct(&local_90,(ulong)uVar7,'\0');
    CLI::std::__detail::__to_chars_10_impl<unsigned_int>
              (local_90._M_dataplus._M_p,(uint)local_90._M_string_length,uVar11);
    uVar12 = CONCAT44(local_90._M_string_length._4_4_,(uint)local_90._M_string_length) +
             local_b0._M_string_length;
    uVar13 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar2) {
      uVar13 = local_b0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar13 < uVar12) {
      uVar13 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != paVar1) {
        uVar13 = local_90.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar13 < uVar12) goto LAB_003c0df3;
      pbVar8 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::replace(&local_90,0,0,local_b0._M_dataplus._M_p,local_b0._M_string_length);
    }
    else {
LAB_003c0df3:
      pbVar8 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::_M_append(&local_b0,local_90._M_dataplus._M_p,
                           CONCAT44(local_90._M_string_length._4_4_,(uint)local_90._M_string_length)
                          );
    }
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(pbVar8->_M_dataplus)._M_p;
    paVar3 = &pbVar8->field_2;
    if (paVar4 == paVar3) {
      local_f0.field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
      local_f0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
    }
    else {
      local_f0.field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
      local_f0._M_dataplus._M_p = (pointer)paVar4;
    }
    local_f0._M_string_length = pbVar8->_M_string_length;
    (pbVar8->_M_dataplus)._M_p = (pointer)paVar3;
    pbVar8->_M_string_length = 0;
    paVar3->_M_local_buf[0] = '\0';
    paVar3 = &local_d0.field_2;
    local_d0._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0," in unknown file","");
    uVar12 = CONCAT44(local_d0._M_string_length._4_4_,(uint)local_d0._M_string_length) +
             local_f0._M_string_length;
    uVar13 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      uVar13 = local_f0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar13 < uVar12) {
      uVar13 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != paVar3) {
        uVar13 = local_d0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar13 < uVar12) goto LAB_003c0ebb;
      pbVar8 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::replace(&local_d0,0,0,local_f0._M_dataplus._M_p,local_f0._M_string_length);
    }
    else {
LAB_003c0ebb:
      pbVar8 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::_M_append(&local_f0,local_d0._M_dataplus._M_p,
                           CONCAT44(local_d0._M_string_length._4_4_,(uint)local_d0._M_string_length)
                          );
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar5 = (pbVar8->_M_dataplus)._M_p;
    paVar4 = &pbVar8->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar5 == paVar4) {
      uVar13 = *(undefined8 *)((long)&pbVar8->field_2 + 8);
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar4->_M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar13;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = pcVar5;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar4->_M_allocated_capacity;
    }
    __return_storage_ptr__->_M_string_length = pbVar8->_M_string_length;
    (pbVar8->_M_dataplus)._M_p = (pointer)paVar4;
    pbVar8->_M_string_length = 0;
    paVar4->_M_local_buf[0] = '\0';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar3) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    local_90.field_2._M_allocated_capacity = local_b0.field_2._M_allocated_capacity;
    _Var14._M_p = local_b0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p == paVar2) {
      return __return_storage_ptr__;
    }
    goto LAB_003c0f6f;
  }
  paVar2 = &local_90.field_2;
  local_90._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90," at line ","");
  if (*(long *)this == 0) {
    uVar11 = 0;
  }
  else {
    uVar11 = *(uint *)(*(long *)this + 0x10);
  }
  uVar7 = 1;
  if (9 < uVar11) {
    uVar12 = (ulong)uVar11;
    uVar6 = 4;
    do {
      uVar7 = uVar6;
      uVar10 = (uint)uVar12;
      if (uVar10 < 100) {
        uVar7 = uVar7 - 2;
        goto LAB_003c0a6b;
      }
      if (uVar10 < 1000) {
        uVar7 = uVar7 - 1;
        goto LAB_003c0a6b;
      }
      if (uVar10 < 10000) goto LAB_003c0a6b;
      uVar12 = uVar12 / 10000;
      uVar6 = uVar7 + 4;
    } while (99999 < uVar10);
    uVar7 = uVar7 + 1;
  }
LAB_003c0a6b:
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_d0,(ulong)uVar7,'\0');
  CLI::std::__detail::__to_chars_10_impl<unsigned_int>
            (local_d0._M_dataplus._M_p,(uint)local_d0._M_string_length,uVar11);
  uVar12 = CONCAT44(local_d0._M_string_length._4_4_,(uint)local_d0._M_string_length) +
           CONCAT44(local_90._M_string_length._4_4_,(uint)local_90._M_string_length);
  uVar13 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    uVar13 = local_90.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar13 < uVar12) {
    uVar13 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      uVar13 = local_d0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar13 < uVar12) goto LAB_003c0acf;
    pbVar8 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_d0,0,0,local_90._M_dataplus._M_p,
                     CONCAT44(local_90._M_string_length._4_4_,(uint)local_90._M_string_length));
  }
  else {
LAB_003c0acf:
    pbVar8 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_90,local_d0._M_dataplus._M_p,
                       CONCAT44(local_d0._M_string_length._4_4_,(uint)local_d0._M_string_length));
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar8->_M_dataplus)._M_p;
  paVar1 = &pbVar8->field_2;
  if (paVar3 == paVar1) {
    local_b0.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_b0.field_2._8_4_ = *(undefined4 *)((long)&pbVar8->field_2 + 8);
    local_b0.field_2._12_4_ = *(undefined4 *)((long)&pbVar8->field_2 + 0xc);
  }
  else {
    local_b0.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_b0._M_dataplus._M_p = (pointer)paVar3;
  }
  local_b0._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar8->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  paVar1 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50," in file ","");
  uVar13 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    uVar13 = local_b0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar13 < local_50._M_string_length + local_b0._M_string_length) {
    uVar13 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      uVar13 = local_50.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar13 < local_50._M_string_length + local_b0._M_string_length) goto LAB_003c0ba5;
    pbVar8 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_50,0,0,local_b0._M_dataplus._M_p,local_b0._M_string_length);
  }
  else {
LAB_003c0ba5:
    pbVar8 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_b0,local_50._M_dataplus._M_p,local_50._M_string_length);
  }
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar8->_M_dataplus)._M_p;
  paVar3 = &pbVar8->field_2;
  if (paVar4 == paVar3) {
    local_f0.field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
    local_f0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_f0.field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
    local_f0._M_dataplus._M_p = (pointer)paVar4;
  }
  local_f0._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar3;
  pbVar8->_M_string_length = 0;
  paVar3->_M_local_buf[0] = '\0';
  paVar3 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar3;
  sVar9 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,__s,__s + sVar9);
  uVar13 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    uVar13 = local_f0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar13 < local_70._M_string_length + local_f0._M_string_length) {
    uVar13 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar3) {
      uVar13 = local_70.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar13 < local_70._M_string_length + local_f0._M_string_length) goto LAB_003c0c86;
    pbVar8 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_70,0,0,local_f0._M_dataplus._M_p,local_f0._M_string_length);
  }
  else {
LAB_003c0c86:
    pbVar8 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_f0,local_70._M_dataplus._M_p,local_70._M_string_length);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar5 = (pbVar8->_M_dataplus)._M_p;
  paVar4 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 == paVar4) {
    uVar13 = *(undefined8 *)((long)&pbVar8->field_2 + 8);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar4->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar13;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar5;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar4->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar4;
  pbVar8->_M_string_length = 0;
  paVar4->_M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar3) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  _Var14._M_p = local_90._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p == paVar2) {
    return __return_storage_ptr__;
  }
LAB_003c0f6f:
  operator_delete(_Var14._M_p,local_90.field_2._M_allocated_capacity + 1);
  return __return_storage_ptr__;
}

Assistant:

inline std::string to_string(const source_location& loc)
{
    const char* fname = loc.file_name();
    if(fname)
    {
        return std::string(" at line ") + std::to_string(loc.line()) +
               std::string(" in file ") + std::string(fname);
    }
    else
    {
        return std::string(" at line ") + std::to_string(loc.line()) +
               std::string(" in unknown file");
    }
}